

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

bool D_LoadDehFile(char *patchfile)

{
  FILE *__stream;
  FString local_30;
  FString filebase;
  int lumpnum;
  FILE *deh;
  char *patchfile_local;
  
  __stream = fopen(patchfile,"rb");
  if (__stream == (FILE *)0x0) {
    filebase.Chars._4_4_ = FWadCollection::CheckNumForFullName(&Wads,patchfile,true,0);
    if (filebase.Chars._4_4_ < 0) {
      ExtractFileBase((char *)&local_30,SUB81(patchfile,0));
      filebase.Chars._4_4_ = FWadCollection::CheckNumForName(&Wads,&local_30);
      FString::~FString(&local_30);
    }
    if (filebase.Chars._4_4_ < 0) {
      Printf("Could not open DeHackEd patch \"%s\"\n",patchfile);
      patchfile_local._7_1_ = false;
    }
    else {
      patchfile_local._7_1_ = D_LoadDehLump(filebase.Chars._4_4_);
    }
  }
  else {
    PatchSize = Q_filelength((FILE *)__stream);
    PatchName = copystring(patchfile);
    PatchFile = (char *)operator_new__((long)(PatchSize + 1));
    fread(PatchFile,1,(long)PatchSize,__stream);
    fclose(__stream);
    PatchFile[PatchSize] = '\0';
    patchfile_local._7_1_ = DoDehPatch();
  }
  return patchfile_local._7_1_;
}

Assistant:

bool D_LoadDehFile(const char *patchfile)
{
	FILE *deh;

	deh = fopen(patchfile, "rb");
	if (deh != NULL)
	{
		PatchSize = Q_filelength(deh);

		PatchName = copystring(patchfile);
		PatchFile = new char[PatchSize + 1];
		fread(PatchFile, 1, PatchSize, deh);
		fclose(deh);
		PatchFile[PatchSize] = '\0';		// terminate with a '\0' character
		return DoDehPatch();
	}
	else
	{
		// Couldn't find it in the filesystem; try from a lump instead.
		int lumpnum = Wads.CheckNumForFullName(patchfile, true);
		if (lumpnum < 0)
		{
			// Compatibility fallback. It's just here because
			// some WAD may need it. Should be deleted if it can
			// be confirmed that nothing uses this case.
			FString filebase(ExtractFileBase(patchfile));
			lumpnum = Wads.CheckNumForName(filebase);
		}
		if (lumpnum >= 0)
		{
			return D_LoadDehLump(lumpnum);
		}
	}
	Printf ("Could not open DeHackEd patch \"%s\"\n", patchfile);
	return false;
}